

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestNestedMessageHasBits_NestedMessage::_InternalSerialize
          (TestNestedMessageHasBits_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  const_reference piVar3;
  ulong uVar4;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *value;
  uint8_t *puVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  
  iVar2 = google::protobuf::internal::SooRep::size
                    ((SooRep *)&(this->field_0)._impl_,
                     (undefined1  [48])((undefined1  [48])this->field_0 & (undefined1  [48])0x4) ==
                     (undefined1  [48])0x0);
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar3 = google::protobuf::RepeatedField<int>::Get
                         (&(this->field_0)._impl_.nestedmessage_repeated_int32_,iVar7);
      uVar4 = (ulong)*piVar3;
      pbVar8 = target + 1;
      *target = 8;
      uVar6 = uVar4;
      if (0x7f < uVar4) {
        do {
          *pbVar8 = (byte)uVar6 | 0x80;
          uVar4 = uVar6 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar4;
        } while (bVar1);
      }
      *pbVar8 = (byte)uVar4;
      target = pbVar8 + 1;
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar2);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x18);
  if (iVar2 != 0) {
    iVar7 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                        (&(this->field_0)._impl_.nestedmessage_repeated_foreignmessage_.
                          super_RepeatedPtrFieldBase,iVar7);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                          stream);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageHasBits_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestNestedMessageHasBits.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 nestedmessage_repeated_int32 = 1;
  for (int i = 0, n = this_._internal_nestedmessage_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1, this_._internal_nestedmessage_repeated_int32().Get(i), target);
  }

  // repeated .proto2_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nestedmessage_repeated_foreignmessage_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nestedmessage_repeated_foreignmessage().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestNestedMessageHasBits.NestedMessage)
  return target;
}